

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncstate.cpp
# Opt level: O3

SQInteger __thiscall SQFuncState::PopTarget(SQFuncState *this)

{
  SQLocalVarInfo *pSVar1;
  long lVar2;
  SQUnsignedInteger SVar3;
  
  pSVar1 = (this->_vlocals)._vals;
  SVar3 = (this->_targetstack)._size;
  lVar2 = (this->_targetstack)._vals[SVar3 - 1];
  if (pSVar1[lVar2]._name.super_SQObject._type == OT_NULL) {
    SVar3 = (this->_vlocals)._size - 1;
    (this->_vlocals)._size = SVar3;
    SQObjectPtr::~SQObjectPtr(&pSVar1[SVar3]._name);
    SVar3 = (this->_targetstack)._size;
  }
  (this->_targetstack)._size = SVar3 - 1;
  return lVar2;
}

Assistant:

SQInteger SQFuncState::PopTarget()
{
    SQUnsignedInteger npos=_targetstack.back();
    assert(npos < _vlocals.size());
    SQLocalVarInfo &t = _vlocals[npos];
    if(sq_type(t._name)==OT_NULL){
        _vlocals.pop_back();
    }
    _targetstack.pop_back();
    return npos;
}